

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O1

expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
tinyusdz::anon_unknown_0::ExpandWithIndices<tinyusdz::value::normal3f>
          (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,
          vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *values,
          uint32_t elementSize,vector<int,_std::allocator<int>_> *indices,
          vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *dest)

{
  uint uVar1;
  pointer piVar2;
  pointer pnVar3;
  pointer pnVar4;
  size_type sVar5;
  value_type_conflict vVar6;
  long *plVar7;
  pointer piVar8;
  long lVar9;
  ulong *puVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  vector<unsigned_long,_std::allocator<unsigned_long>_> invalidIndices;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_a8;
  _Alloc_hider local_90;
  undefined8 local_88;
  ulong local_80;
  long lStack_78;
  ulong *local_70;
  undefined8 local_68;
  ulong local_60;
  long lStack_58;
  string local_50;
  
  if (dest == (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *)0x0)
  {
    local_90._M_p = "`dest` is nullptr.";
    nonstd::expected_lite::
    expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<const_char_*,_0>(__return_storage_ptr__,(unexpected_type<const_char_*> *)&local_90);
  }
  else {
    piVar8 = (indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar2 = (indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (piVar8 == piVar2) {
      ::std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::
      operator=(dest,values);
      (__return_storage_ptr__->contained).
      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .m_has_value = true;
      (__return_storage_ptr__->contained).
      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_value = true;
    }
    else if ((elementSize == 0) ||
            (uVar11 = (ulong)elementSize,
            (ulong)(((long)(values->
                           super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(values->
                           super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                           )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555) %
            uVar11 != 0)) {
      (__return_storage_ptr__->contained).
      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .m_has_value = true;
      (__return_storage_ptr__->contained).
      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_value = false;
    }
    else {
      ::std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::resize
                (dest,((long)piVar2 - (long)piVar8 >> 2) * uVar11);
      local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
      local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (unsigned_long *)0x0;
      local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
      local_90._M_p = (pointer)0x0;
      piVar8 = (indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_finish == piVar8) {
        vVar6 = true;
      }
      else {
        vVar6 = true;
        do {
          uVar1 = piVar8[(long)local_90._M_p];
          if (((int)uVar1 < 0) ||
             (uVar12 = ((ulong)uVar1 + 1) * uVar11,
             lVar13 = (long)(values->
                            super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(values->
                            super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 2,
             (ulong)(lVar13 * -0x5555555555555555) <= uVar12 &&
             uVar12 + lVar13 * 0x5555555555555555 != 0)) {
            if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long_const&>
                        ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_a8,
                         (iterator)
                         local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_90);
            }
            else {
              *local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish = (unsigned_long)local_90._M_p;
              local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            vVar6 = false;
          }
          else {
            lVar9 = (ulong)uVar1 * uVar11 * 0xc;
            lVar13 = (long)local_90._M_p * uVar11 * 0xc;
            uVar12 = uVar11;
            do {
              pnVar3 = (values->
                       super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              pnVar4 = (dest->
                       super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              *(undefined4 *)((long)&pnVar4->z + lVar13) = *(undefined4 *)((long)&pnVar3->z + lVar9)
              ;
              *(undefined8 *)((long)&pnVar4->x + lVar13) = *(undefined8 *)((long)&pnVar3->x + lVar9)
              ;
              lVar9 = lVar9 + 0xc;
              lVar13 = lVar13 + 0xc;
              uVar12 = uVar12 - 1;
            } while (uVar12 != 0);
          }
          local_90._M_p = local_90._M_p + 1;
          piVar8 = (indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        } while (local_90._M_p <
                 (ulong *)((long)(indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_finish - (long)piVar8 >> 2));
      }
      if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start) {
        (__return_storage_ptr__->contained).
        super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .m_has_value = true;
        (__return_storage_ptr__->contained).
        super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .field_0.m_value = vVar6;
      }
      else {
        tinyusdz::value::print_array_snipped<unsigned_long>(&local_50,&local_a8,5);
        plVar7 = (long *)::std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x61cacc);
        puVar10 = (ulong *)(plVar7 + 2);
        if ((ulong *)*plVar7 == puVar10) {
          local_60 = *puVar10;
          lStack_58 = plVar7[3];
          local_70 = &local_60;
        }
        else {
          local_60 = *puVar10;
          local_70 = (ulong *)*plVar7;
        }
        local_80 = local_60;
        sVar5 = plVar7[1];
        *plVar7 = (long)puVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if (local_70 == &local_60) {
          lStack_78 = lStack_58;
          local_90._M_p = (pointer)&local_80;
        }
        else {
          local_90._M_p = (pointer)local_70;
        }
        local_60 = local_60 & 0xffffffffffffff00;
        (__return_storage_ptr__->contained).
        super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .m_has_value = false;
        puVar10 = (ulong *)((long)&(__return_storage_ptr__->contained).
                                   super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   .field_0 + 0x10);
        *(ulong **)
         &(__return_storage_ptr__->contained).
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .field_0 = puVar10;
        if ((ulong *)local_90._M_p == &local_80) {
          *puVar10 = local_80;
          *(long *)((long)&(__return_storage_ptr__->contained).
                           super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           .field_0 + 0x18) = lStack_78;
        }
        else {
          (__return_storage_ptr__->contained).
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .field_0.m_error._M_dataplus._M_p = local_90._M_p;
          *(ulong *)((long)&(__return_storage_ptr__->contained).
                            super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            .field_0 + 0x10) = local_80;
        }
        (__return_storage_ptr__->contained).
        super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .field_0.m_error._M_string_length = sVar5;
        local_80 = local_80 & 0xffffffffffffff00;
        local_68 = 0;
        local_88 = 0;
        local_90._M_p = (pointer)&local_80;
        local_70 = &local_60;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
        operator_delete(local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_a8.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a8.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::expected<bool, std::string> ExpandWithIndices(
    const std::vector<T> &values, uint32_t elementSize, const std::vector<int32_t> &indices,
    std::vector<T> *dest) {
  if (!dest) {
    return nonstd::make_unexpected("`dest` is nullptr.");
  }

  if (indices.empty()) {
    (*dest) = values;
    return true;
  }

  if (elementSize == 0) {
    return false;
  }

  if ((values.size() % elementSize) != 0) {
    return false;
  }

  dest->resize(indices.size() * elementSize);

  std::vector<size_t> invalidIndices;

  bool valid = true;
  for (size_t i = 0; i < indices.size(); i++) {
    int32_t idx = indices[i];
    if ((idx >= 0) && ((size_t(idx+1) * size_t(elementSize)) <= values.size())) {
      for (size_t k = 0; k < elementSize; k++) {
        (*dest)[i*elementSize + k] = values[size_t(idx)*elementSize + k];
      }
    } else {
      invalidIndices.push_back(i);
      valid = false;
    }
  }

  if (invalidIndices.size()) {
    return nonstd::make_unexpected(
        "Invalid indices found: " +
        value::print_array_snipped(invalidIndices,
                                   /* N to display */ 5));
  }

  return valid;
}